

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  type tVar6;
  type tVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  long lVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  size_t count;
  ulong uVar16;
  char format [7];
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x9c0,"empty buffer");
  }
  uVar12 = 5;
  if (-1 < precision) {
    uVar12 = precision - 1;
  }
  bVar13 = specs._4_1_;
  if (1 < bVar13) {
    uVar12 = precision;
  }
  format[0] = '%';
  uVar14 = specs._4_4_;
  if (bVar13 == 3 && (uVar14 >> 0x14 & 1) != 0) {
    pcVar8 = format + 2;
    format[1] = '#';
  }
  else {
    pcVar8 = format + 1;
  }
  if (-1 < (int)uVar12) {
    pcVar8[0] = '.';
    pcVar8[1] = '*';
    pcVar8 = pcVar8 + 2;
  }
  *pcVar8 = 'L';
  if (bVar13 == 3) {
    bVar10 = ((uVar14 >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar10 = (bVar13 == 2) + 0x65;
  }
  pcVar8[1] = bVar10;
  pcVar8[2] = '\0';
  sVar3 = buf->size_;
LAB_00324b3a:
  while( true ) {
    pcVar8 = buf->ptr_ + sVar3;
    uVar16 = buf->capacity_ - sVar3;
    if ((int)uVar12 < 0) {
      iVar5 = snprintf(pcVar8,uVar16,format);
    }
    else {
      iVar5 = snprintf(pcVar8,uVar16,format,(ulong)uVar12);
    }
    if (iVar5 < 0) goto LAB_00324ba2;
    tVar6 = to_unsigned<int>(iVar5);
    count = (size_t)tVar6;
    if (count < uVar16) break;
    uVar16 = count + sVar3 + 1;
    if (buf->capacity_ < uVar16) goto LAB_00324baf;
  }
  if (bVar13 == 2) {
    if (precision != 0) {
      uVar16 = 1;
      do {
        lVar11 = uVar16 + (count - 2);
        uVar16 = uVar16 - 1;
      } while ((byte)(pcVar8[lVar11] - 0x30U) < 10);
      tVar7 = to_unsigned<int>(-(int)uVar16);
      memmove(pcVar8 + uVar16 + count + -1,pcVar8 + uVar16 + count,(ulong)tVar7);
      buffer<char>::try_resize(buf,(ulong)(tVar6 - 1));
      goto LAB_00324cff;
    }
  }
  else {
    if ((uVar14 & 0xff) != 3) {
      lVar11 = 2;
      do {
        lVar1 = lVar11 + (count - 3);
        lVar11 = lVar11 + -1;
      } while (pcVar8[lVar1] != 'e');
      lVar1 = lVar11 + count;
      cVar2 = pcVar8[lVar1 + -1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        __assert_fail("sign == \'+\' || sign == \'-\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                      ,0xa0e,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                     );
      }
      pcVar9 = pcVar8 + lVar11 + count + -3;
      iVar5 = (int)lVar11;
      iVar15 = 0;
      do {
        if (9 < (byte)(pcVar8[lVar11 + count] - 0x30U)) {
          __assert_fail("is_digit(*p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                        ,0xa12,
                        "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                       );
        }
        iVar15 = iVar15 * 10 + (uint)(byte)pcVar8[lVar11 + count] + -0x30;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0);
      iVar4 = -iVar15;
      if (cVar2 != '-') {
        iVar4 = iVar15;
      }
      iVar15 = 0;
      if (lVar1 != 3) {
        iVar15 = iVar5 + tVar6 + -3;
        do {
          iVar15 = iVar15 + -1;
          cVar2 = *pcVar9;
          pcVar9 = pcVar9 + -1;
        } while (cVar2 == '0');
        tVar6 = to_unsigned<int>(iVar15);
        memmove(pcVar8 + 1,pcVar8 + 2,(ulong)tVar6);
      }
      tVar6 = to_unsigned<int>(iVar15);
      buffer<char>::try_resize(buf,sVar3 + 1 + (ulong)tVar6);
      uVar16 = (ulong)(uint)(iVar4 - iVar15);
      goto LAB_00324cff;
    }
    count = sVar3 + count;
  }
  buffer<char>::try_resize(buf,count);
  uVar16 = 0;
LAB_00324cff:
  return (int)uVar16;
LAB_00324ba2:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar16 = buf->capacity_ + 1;
LAB_00324baf:
    (**buf->_vptr_buffer)(buf,uVar16);
  }
  goto LAB_00324b3a;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}